

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O0

void __thiscall
PFData_test_loadData_Test::~PFData_test_loadData_Test(PFData_test_loadData_Test *this)

{
  void *in_RDI;
  
  ~PFData_test_loadData_Test((PFData_test_loadData_Test *)0x12b728);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(PFData_test, loadData) {
    // this file needs to exist, and should load
    PFData test("tests/inputs/press.init.pfb");
    int retval = test.loadHeader();
    ASSERT_EQ(0,retval);
    retval = test.loadData();
    ASSERT_EQ(0,retval);
    double* data = test.getData();
    EXPECT_NE(nullptr, data);
    EXPECT_NEAR(98.003604098773,test(0,0,0),1E-12);
    EXPECT_NEAR(97.36460429313328,test(0,0,40),1E-12);
    EXPECT_NEAR(98.0043134691891,test(0,1,0),1E-12);
    EXPECT_NEAR(98.00901307022781,test(0,0,1),1E-12);
    EXPECT_NEAR(92.61370155558751,test(2,1,21),1E-12);
    EXPECT_NEAR(7.98008728357588,test(45,1,0),1E-12);
    EXPECT_NEAR(97.30205516102234,test(0,1,22),1E-12);
    test.close();
}